

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdD3D56TlvRhw::emulate_mthd(MthdD3D56TlvRhw *this)

{
  byte bVar1;
  int vidx;
  MthdD3D56TlvRhw *this_local;
  
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tlv_rhw =
       (this->super_SingleMthdTest).super_MthdTest.val & 0xffffffc0;
  if ((((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_c <<
              0x36) < 0) &&
      (4 < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
           chipset.chipset)) &&
     (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tlv_rhw & 0x7fffffff) <
      0xa800000)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tlv_rhw =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tlv_rhw & 0x80000000
         | 0xa800000;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xfffffffb | 4;
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x48) {
    bVar1 = (byte)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                  d3d56_tlv_fog_tri_col1 & 0xf;
  }
  else {
    bVar1 = (byte)*(undefined4 *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] &
       ((uint)(1L << (bVar1 & 0x3f)) ^ 0xffffffff) | (uint)(0L << (bVar1 & 0x3f));
  return;
}

Assistant:

void emulate_mthd() override {
		exp.d3d56_tlv_rhw = val & ~0x3f;
		if (extr(exp.debug_c, 9, 1) && chipset.chipset >= 5) {
			if (extr(exp.d3d56_tlv_rhw, 0, 31) < 0xa800000)
				insrt(exp.d3d56_tlv_rhw, 0, 31, 0xa800000);
		}
		insrt(exp.valid[1], 2, 1, 1);
		int vidx = (cls == 0x48 ? extr(exp.d3d56_tlv_fog_tri_col1, 0, 4) : idx);
		insrt(exp.valid[0], vidx, 1, 0);
	}